

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keymap.c
# Opt level: O0

void load_keymap(void)

{
  void *__src;
  nh_cmd_desc *cmdlist;
  
  __src = (void *)nh_get_commands(&cmdcount);
  commandlist = (nh_cmd_desc *)malloc((long)cmdcount * 0x6c);
  memcpy(commandlist,__src,(long)cmdcount * 0x6c);
  init_keymap();
  read_keymap();
  return;
}

Assistant:

void load_keymap(void)
{
    struct nh_cmd_desc *cmdlist = nh_get_commands(&cmdcount);
    
    commandlist = malloc(cmdcount * sizeof(struct nh_cmd_desc));
    memcpy(commandlist, cmdlist, cmdcount * sizeof(struct nh_cmd_desc));

    /* always init the keymap - read keymap might not set up every mapping */
    init_keymap();
    read_keymap();
}